

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mocks.c
# Opt level: O0

void always_expect_(TestReporter *test_reporter,char *function,char *test_file,int test_line,...)

{
  _Bool _Var1;
  RecordedExpectation *pRVar2;
  undefined4 in_ECX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  __va_list_tag *in_R9;
  CgreenVector *constraints_vector;
  RecordedExpectation *expectation;
  va_list constraints;
  CgreenVector *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff14;
  char *in_stack_ffffffffffffff18;
  __va_list_tag *in_stack_ffffffffffffff20;
  
  _Var1 = have_always_expectation_for(in_stack_ffffffffffffff18);
  if (_Var1) {
    (**(code **)(in_RDI + 0x38))
              (in_RDI,in_RDX,in_ECX,0,
               "Mocked function [%s] already has an expectation and will always be called a certain way; any expectations declared after an always expectation are discarded"
               ,in_RSI);
    destroy_constraints(in_stack_ffffffffffffff20);
  }
  else {
    _Var1 = have_never_call_expectation_for(in_stack_ffffffffffffff18);
    if (_Var1) {
      remove_never_call_expectation_for((char *)in_stack_ffffffffffffff20);
      (**(code **)(in_RDI + 0x38))
                (in_RDI,in_RDX,in_ECX,0,
                 "Mocked function [%s] already has an expectation that it will never be called; any expectations declared after a never call expectation are discarded"
                 ,in_RSI);
      destroy_constraints(in_stack_ffffffffffffff20);
    }
    else {
      constraints_vector_from_va_list(in_R9);
      pRVar2 = create_recorded_expectation
                         ((char *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                          in_stack_ffffffffffffff14,in_stack_ffffffffffffff08);
      pRVar2->time_to_live = 0xf314159;
      cgreen_vector_add((CgreenVector *)
                        CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                        in_stack_ffffffffffffff08);
    }
  }
  return;
}

Assistant:

void always_expect_(TestReporter* test_reporter, const char *function, const char *test_file, int test_line, ...) {
    va_list constraints;
    RecordedExpectation *expectation;
    CgreenVector *constraints_vector;

    if (have_always_expectation_for(function)) {
        test_reporter->assert_true(
                test_reporter,
                test_file,
                test_line,
                false,
                "Mocked function [%s] already has an expectation and will always be called a certain way; "
                "any expectations declared after an always expectation are discarded", function);
        va_start(constraints, test_line);
        destroy_constraints(constraints);
        va_end(constraints);

        return;
    }

    if (have_never_call_expectation_for(function)) {
        remove_never_call_expectation_for(function);

        test_reporter->assert_true(
                test_reporter,
                test_file,
                test_line,
                false,
                "Mocked function [%s] already has an expectation that it will never be called; "
                "any expectations declared after a never call expectation are discarded", function);
        va_start(constraints, test_line);
        destroy_constraints(constraints);
        va_end(constraints);

        return;
    }

    va_start(constraints, test_line);
    constraints_vector = constraints_vector_from_va_list(constraints);
    expectation = create_recorded_expectation(function, test_file, test_line, constraints_vector);
    va_end(constraints);
    expectation->time_to_live = UNLIMITED_TIME_TO_LIVE;
    cgreen_vector_add(global_expectation_queue, expectation);
}